

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_filedata(curl_mimepart *part,char *filename)

{
  curl_strdup_callback p_Var1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  CURLcode CVar5;
  stat sbuf;
  stat64 local_c0;
  
  if (part == (curl_mimepart *)0x0) {
    CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    cleanup_part_content(part);
    if (filename == (char *)0x0) {
      CVar5 = CURLE_OK;
    }
    else {
      iVar2 = stat64(filename,&local_c0);
      CVar5 = CURLE_READ_ERROR;
      if (iVar2 == 0) {
        pcVar3 = (*Curl_cstrdup)(filename);
        part->data = pcVar3;
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (pcVar3 != (char *)0x0) {
          part->datasize = -1;
          if ((local_c0.st_mode & 0xf000) == 0x8000) {
            part->datasize = local_c0.st_size;
            part->seekfunc = mime_file_seek;
          }
          part->readfunc = mime_file_read;
          part->freefunc = mime_file_free;
          part->kind = MIMEKIND_FILE;
          pcVar3 = (*Curl_cstrdup)(filename);
          p_Var1 = Curl_cstrdup;
          if (pcVar3 != (char *)0x0) {
            pcVar4 = __xpg_basename(pcVar3);
            pcVar4 = (*p_Var1)(pcVar4);
            (*Curl_cfree)(pcVar3);
            if (pcVar4 != (char *)0x0) {
              (*Curl_cfree)(part->filename);
              part->filename = (char *)0x0;
              pcVar3 = (*Curl_cstrdup)(pcVar4);
              part->filename = pcVar3;
              CVar5 = CURLE_OUT_OF_MEMORY;
              if (pcVar3 != (char *)0x0) {
                CVar5 = CURLE_OK;
              }
              (*Curl_cfree)(pcVar4);
            }
          }
        }
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode curl_mime_filedata(curl_mimepart *part, const char *filename)
{
  CURLcode result = CURLE_OK;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(filename) {
    char *base;
    struct_stat sbuf;

    if(stat(filename, &sbuf))
      result = CURLE_READ_ERROR;
    else {
      part->data = strdup(filename);
      if(!part->data)
        result = CURLE_OUT_OF_MEMORY;
      else {
        part->datasize = -1;
        if(S_ISREG(sbuf.st_mode)) {
          part->datasize = filesize(filename, sbuf);
          part->seekfunc = mime_file_seek;
        }

        part->readfunc = mime_file_read;
        part->freefunc = mime_file_free;
        part->kind = MIMEKIND_FILE;

        /* As a side effect, set the filename to the current file's base name.
           It is possible to withdraw this by explicitly calling
           curl_mime_filename() with a NULL filename argument after the current
           call. */
        base = strippath(filename);
        if(!base)
          result = CURLE_OUT_OF_MEMORY;
        else {
          result = curl_mime_filename(part, base);
          free(base);
        }
      }
    }
  }
  return result;
}